

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O1

void __thiscall TPZFBMatrix<double>::Transpose(TPZFBMatrix<double> *this,TPZMatrix<double> *T)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar3;
  long lVar4;
  int64_t c;
  long lVar5;
  undefined1 local_38 [8];
  
  iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  if (CONCAT44(extraout_var_01,iVar1) != 0 && -1 < extraout_var_01) {
    lVar4 = 0;
    do {
      lVar5 = lVar4 - this->fBandLower;
      if (lVar5 < 1) {
        lVar5 = 0;
      }
      lVar3 = this->fBandUpper;
      iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      if (lVar4 + lVar3 + 1 < CONCAT44(extraout_var_02,iVar1)) {
        lVar3 = lVar4 + this->fBandUpper + 1;
      }
      else {
        iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xc])(this);
        lVar3 = CONCAT44(extraout_var_03,iVar1);
      }
      for (; lVar5 < lVar3; lVar5 = lVar5 + 1) {
        (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,lVar4,lVar5);
        (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(T,lVar5,lVar4,local_38);
      }
      lVar4 = lVar4 + 1;
      iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
    } while (lVar4 < CONCAT44(extraout_var_04,iVar1));
  }
  return;
}

Assistant:

void
TPZFBMatrix<TVar>::Transpose (TPZMatrix<TVar> *const T) const
{
	T->Resize( Dim(), Dim() );
	
	int64_t end, begin;
	//REAL *p = fElem;
	for ( int64_t r = 0; r < Dim(); r++ )
    {
		begin = MAX( r - fBandLower, 0 );
		end   = MIN( r + fBandUpper + 1, Dim() );
		for ( int64_t c = begin; c < end; c++ )
		{
			T->PutVal( c, r, GetVal( r, c ) );
			//			cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
		}
    }
}